

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O0

void ga_c2fstring(char *cstring,char *fstring,int flength)

{
  size_t sVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  int clength;
  int local_18;
  int local_14;
  char *local_10;
  char *local_8;
  
  sVar1 = strlen(in_RDI);
  local_18 = (int)sVar1;
  if (in_RDI[local_18] == '\n') {
    local_18 = local_18 + -1;
  }
  if (in_EDX < local_18) {
    local_18 = in_EDX;
  }
  local_14 = in_EDX - local_18;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_18 != 0) {
    *local_10 = *local_8;
    local_18 = local_18 + -1;
    local_10 = local_10 + 1;
    local_8 = local_8 + 1;
  }
  while (local_14 != 0) {
    *local_10 = ' ';
    local_14 = local_14 + -1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void ga_c2fstring(char *cstring, char *fstring, int flength)
{
    int clength = strlen(cstring);

    /* remove terminal \n character if any */
    if(cstring[clength] == '\n') {
        clength--;
    }

    /* Truncate C string into Fortran string */
    if (clength > flength) {
        clength = (int)flength;
    }

    /* Copy characters over */
    flength -= clength;
    while (clength--) {
        *fstring++ = *cstring++;
    }

    /* Now terminate with blanks */
    while (flength--) {
        *fstring++ = ' ';
    }
}